

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpTestLog.c
# Opt level: O3

deBool qpTestLog_writeImage
                 (qpTestLog *log,char *name,char *description,qpImageCompressionMode compressionMode
                 ,qpImageFormat imageFormat,int width,int height,int stride,void *data)

{
  deBool dVar1;
  deBool dVar2;
  png_byte **rowPointers;
  png_structp png;
  png_infop info;
  int iVar3;
  ulong uVar4;
  int iVar5;
  deUint8 *ptr;
  int iVar6;
  char widthStr [32];
  qpXmlAttribute attribs [8];
  char heightStr [32];
  Buffer local_1a8;
  size_t local_190;
  char *local_188;
  char *local_180;
  png_infop local_178 [4];
  qpXmlAttribute local_158;
  char *local_138;
  undefined4 local_130;
  png_infop *local_128;
  undefined8 local_120;
  char *local_118;
  undefined4 local_110;
  char *local_108;
  undefined8 local_100;
  char *local_f8;
  undefined4 local_f0;
  char *local_e8;
  undefined8 local_e0;
  char *local_d8;
  undefined4 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  char *local_b8;
  undefined4 local_b0;
  char *local_a8;
  undefined8 local_a0;
  char local_58 [40];
  
  if ((log->flags & 1) != 0) {
    return 1;
  }
  local_1a8.capacity = 0;
  local_1a8.size = 0;
  local_1a8.data = (deUint8 *)0x0;
  local_188 = name;
  local_180 = description;
  if (compressionMode - QP_IMAGE_COMPRESSION_MODE_PNG < 2) {
    rowPointers = (png_byte **)deMalloc((long)height << 3);
    if (rowPointers == (png_byte **)0x0) {
LAB_0033fba3:
      qpPrintf("WARNING: PNG compression failed -- storing image uncompressed.\n");
      goto LAB_0033fbbc;
    }
    if (0 < height) {
      iVar3 = 0;
      uVar4 = 0;
      do {
        rowPointers[uVar4] = (png_byte *)((long)data + (long)iVar3);
        uVar4 = uVar4 + 1;
        iVar3 = iVar3 + stride;
      } while ((uint)height != uVar4);
    }
    png = (png_structp)png_create_write_struct("1.6.37",0,0,0);
    local_158.name = (char *)png;
    if (png == (png_structp)0x0) {
      local_178[0] = (png_infop)0x0;
LAB_0033fb96:
      deFree(rowPointers);
      goto LAB_0033fba3;
    }
    info = (png_infop)png_create_info_struct(png);
    local_178[0] = info;
    if (info == (png_infop)0x0) {
      png_destroy_write_struct(&local_158,local_178);
      goto LAB_0033fb96;
    }
    png_set_write_fn(png,&local_1a8,pngWriteData,pngFlushData);
    dVar1 = writeCompressedPNG(png,info,rowPointers,width,height,
                               (uint)(imageFormat == QP_IMAGE_FORMAT_RGBA8888) * 4 + 2);
    png_destroy_info_struct(png,local_178);
    png_destroy_write_struct(&local_158,0);
    deFree(rowPointers);
    if (dVar1 == 0) goto LAB_0033fba3;
    local_190 = local_1a8.size;
    iVar3 = 1;
    data = local_1a8.data;
  }
  else {
    if (compressionMode != QP_IMAGE_COMPRESSION_MODE_NONE) {
      dVar1 = 0;
      qpPrintf("qpTestLog_writeImage(): Unknown compression mode: %s\n",
               s_qpImageCompressionModeMap[(int)compressionMode].string);
      ptr = (deUint8 *)0x0;
      goto LAB_0033fe53;
    }
LAB_0033fbbc:
    iVar3 = (4 - (uint)(imageFormat == QP_IMAGE_FORMAT_RGB888)) * width;
    local_190 = (size_t)(iVar3 * height);
    if (iVar3 != stride) {
      dVar1 = Buffer_resize(&local_1a8,local_190);
      if (dVar1 == 0) {
        dVar1 = 0;
        qpPrintf("ERROR: Failed to pack pixels for writing.\n");
        ptr = local_1a8.data;
        goto LAB_0033fe53;
      }
      if (0 < height) {
        uVar4 = (ulong)(uint)height;
        iVar5 = 0;
        iVar6 = 0;
        do {
          memcpy(local_1a8.data + iVar5,(void *)((long)data + (long)iVar6),(long)iVar3);
          iVar6 = iVar6 + stride;
          iVar5 = iVar5 + iVar3;
          uVar4 = uVar4 - 1;
        } while (uVar4 != 0);
      }
      data = (deUint8 *)0x0;
    }
    iVar3 = 0;
  }
  dVar1 = 1;
  deSprintf((char *)local_178,0x20,"%d",(ulong)(uint)width);
  deSprintf(local_58,0x20,"%d",(ulong)(uint)height);
  local_158.name = "Name";
  local_158.type = QP_XML_ATTRIBUTE_STRING;
  local_158.stringValue = local_188;
  local_158.intValue = -0x2a6;
  local_158.boolValue = -1;
  local_138 = "Width";
  local_130 = 0;
  local_128 = local_178;
  local_120 = 0xfffffffffffffd5a;
  local_118 = "Height";
  local_110 = 0;
  local_100 = 0xfffffffffffffd5a;
  local_e8 = s_qpImageFormatMap[(int)imageFormat].string;
  local_f8 = "Format";
  local_f0 = 0;
  local_e0 = 0xfffffffffffffd5a;
  local_c8 = *(undefined8 *)
              ((long)&s_qpImageCompressionModeMap[0].string + (ulong)(uint)(iVar3 << 4));
  local_d8 = "CompressionMode";
  local_d0 = 0;
  local_c0 = 0xfffffffffffffd5a;
  if (local_180 == (char *)0x0) {
    iVar3 = 5;
  }
  else {
    local_b8 = "Description";
    local_b0 = 0;
    local_a8 = local_180;
    local_a0 = 0xfffffffffffffd5a;
    iVar3 = 6;
  }
  local_108 = local_58;
  deMutex_lock(log->lock);
  dVar2 = qpXmlWriter_startElement(log->writer,"Image",iVar3,&local_158);
  if (((dVar2 == 0) ||
      (dVar2 = qpXmlWriter_writeBase64(log->writer,(deUint8 *)data,local_190), dVar2 == 0)) ||
     (dVar2 = qpXmlWriter_endElement(log->writer,"Image"), dVar2 == 0)) {
    dVar1 = 0;
    qpPrintf("qpTestLog_writeImage(): Writing XML failed\n");
  }
  deMutex_unlock(log->lock);
  ptr = local_1a8.data;
LAB_0033fe53:
  deFree(ptr);
  return dVar1;
}

Assistant:

deBool qpTestLog_writeImage	(
	qpTestLog*				log,
	const char*				name,
	const char*				description,
	qpImageCompressionMode	compressionMode,
	qpImageFormat			imageFormat,
	int						width,
	int						height,
	int						stride,
	const void*				data)
{
	char			widthStr[32];
	char			heightStr[32];
	qpXmlAttribute	attribs[8];
	int				numAttribs			= 0;
	Buffer			compressedBuffer;
	const void*		writeDataPtr		= DE_NULL;
	size_t			writeDataBytes		= ~(size_t)0;

	DE_ASSERT(log && name);
	DE_ASSERT(deInRange32(width, 1, 16384));
	DE_ASSERT(deInRange32(height, 1, 16384));
	DE_ASSERT(data);

	if (log->flags & QP_TEST_LOG_EXCLUDE_IMAGES)
		return DE_TRUE; /* Image not logged. */

	Buffer_init(&compressedBuffer);

	/* BEST compression mode defaults to PNG. */
	if (compressionMode == QP_IMAGE_COMPRESSION_MODE_BEST)
	{
#if defined(QP_SUPPORT_PNG)
		compressionMode = QP_IMAGE_COMPRESSION_MODE_PNG;
#else
		compressionMode = QP_IMAGE_COMPRESSION_MODE_NONE;
#endif
	}

#if defined(QP_SUPPORT_PNG)
	/* Try storing with PNG compression. */
	if (compressionMode == QP_IMAGE_COMPRESSION_MODE_PNG)
	{
		deBool compressOk = compressImagePNG(&compressedBuffer, imageFormat, width, height, stride, data);
		if (compressOk)
		{
			writeDataPtr	= compressedBuffer.data;
			writeDataBytes	= compressedBuffer.size;
		}
		else
		{
			/* Fall-back to default compression. */
			qpPrintf("WARNING: PNG compression failed -- storing image uncompressed.\n");
			compressionMode	= QP_IMAGE_COMPRESSION_MODE_NONE;
		}
	}
#endif

	/* Handle image compression. */
	switch (compressionMode)
	{
		case QP_IMAGE_COMPRESSION_MODE_NONE:
		{
			int pixelSize		= imageFormat == QP_IMAGE_FORMAT_RGB888 ? 3 : 4;
			int packedStride	= pixelSize*width;

			if (packedStride == stride)
				writeDataPtr = data;
			else
			{
				/* Need to re-pack pixels. */
				if (Buffer_resize(&compressedBuffer, (size_t)(packedStride*height)))
				{
					int row;
					for (row = 0; row < height; row++)
						memcpy(&compressedBuffer.data[packedStride*row], &((const deUint8*)data)[row*stride], (size_t)(pixelSize*width));
				}
				else
				{
					qpPrintf("ERROR: Failed to pack pixels for writing.\n");
					Buffer_deinit(&compressedBuffer);
					return DE_FALSE;
				}
			}

			writeDataBytes = (size_t)(packedStride*height);
			break;
		}

#if defined(QP_SUPPORT_PNG)
		case QP_IMAGE_COMPRESSION_MODE_PNG:
			DE_ASSERT(writeDataPtr); /* Already handled. */
			break;
#endif

		default:
			qpPrintf("qpTestLog_writeImage(): Unknown compression mode: %s\n", QP_LOOKUP_STRING(s_qpImageCompressionModeMap, compressionMode));
			Buffer_deinit(&compressedBuffer);
			return DE_FALSE;
	}

	/* Fill in attributes. */
	int32ToString(width, widthStr);
	int32ToString(height, heightStr);
	attribs[numAttribs++] = qpSetStringAttrib("Name", name);
	attribs[numAttribs++] = qpSetStringAttrib("Width", widthStr);
	attribs[numAttribs++] = qpSetStringAttrib("Height", heightStr);
	attribs[numAttribs++] = qpSetStringAttrib("Format", QP_LOOKUP_STRING(s_qpImageFormatMap, imageFormat));
	attribs[numAttribs++] = qpSetStringAttrib("CompressionMode", QP_LOOKUP_STRING(s_qpImageCompressionModeMap, compressionMode));
	if (description) attribs[numAttribs++] = qpSetStringAttrib("Description", description);

	/* \note Log lock is acquired after compression! */
	deMutex_lock(log->lock);

	/* <Image ID="result" Name="Foobar" Width="640" Height="480" Format="RGB888" CompressionMode="None">base64 data</Image> */
	if (!qpXmlWriter_startElement(log->writer, "Image", numAttribs, attribs) ||
		!qpXmlWriter_writeBase64(log->writer, (const deUint8*)writeDataPtr, writeDataBytes) ||
		!qpXmlWriter_endElement(log->writer, "Image"))
	{
		qpPrintf("qpTestLog_writeImage(): Writing XML failed\n");
		deMutex_unlock(log->lock);
		Buffer_deinit(&compressedBuffer);
		return DE_FALSE;
	}

	deMutex_unlock(log->lock);

	/* Free compressed data if allocated. */
	Buffer_deinit(&compressedBuffer);

	return DE_TRUE;
}